

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FindDb(sqlite3 *db,Token *pName)

{
  int iVar1;
  char *zName;
  
  zName = sqlite3NameFromToken(db,pName);
  iVar1 = sqlite3FindDbName(db,zName);
  if (zName != (char *)0x0) {
    sqlite3DbFreeNN(db,zName);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindDb(sqlite3 *db, Token *pName){
  int i;                               /* Database number */
  char *zName;                         /* Name we are searching for */
  zName = sqlite3NameFromToken(db, pName);
  i = sqlite3FindDbName(db, zName);
  sqlite3DbFree(db, zName);
  return i;
}